

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_get_first_tensor(ggml_context *ctx)

{
  char *mem_buffer;
  ggml_object *obj;
  ggml_context *ctx_local;
  
  obj = ctx->objects_begin;
  while( true ) {
    if (obj == (ggml_object *)0x0) {
      return (ggml_tensor *)0x0;
    }
    if (obj->type == GGML_OBJECT_TYPE_TENSOR) break;
    obj = obj->next;
  }
  return (ggml_tensor *)((long)ctx->mem_buffer + obj->offs);
}

Assistant:

struct ggml_tensor * ggml_get_first_tensor(const struct ggml_context * ctx) {
    struct ggml_object * obj = ctx->objects_begin;

    char * const mem_buffer = ctx->mem_buffer;

    while (obj != NULL) {
        if (obj->type == GGML_OBJECT_TYPE_TENSOR) {
            return (struct ggml_tensor *)(mem_buffer + obj->offs);
        }

        obj = obj->next;
    }

    return NULL;
}